

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::_InternalSerialize
          (CodeGeneratorRequest *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  size_t __n;
  Version *value;
  ulong uVar2;
  anon_union_96_1_493b367e_for_CodeGeneratorRequest_3 aVar3;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>_>
  *pVVar5;
  uint8_t *puVar6;
  int iVar7;
  char *in_R9;
  undefined8 *puVar8;
  string_view field_name;
  string_view field_name_00;
  string_view s;
  string_view s_00;
  
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  if (0 < iVar1) {
    iVar7 = 0;
    do {
      pVVar4 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.file_to_generate_.super_RepeatedPtrFieldBase,iVar7
                         );
      field_name._M_str = in_R9;
      field_name._M_len = (size_t)"google.protobuf.compiler.CodeGeneratorRequest.file_to_generate";
      internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)(pVVar4->_M_dataplus)._M_p,
                 (char *)(ulong)(uint)pVVar4->_M_string_length,1,0x3e,field_name);
      __n = pVVar4->_M_string_length;
      if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = '\n';
        target[1] = (uint8_t)__n;
        memcpy(target + 2,(pVVar4->_M_dataplus)._M_p,__n);
        target = target + __n + 2;
      }
      else {
        s._M_str = (pVVar4->_M_dataplus)._M_p;
        s._M_len = __n;
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,1,s,target);
      }
      iVar7 = iVar7 + 1;
    } while (iVar1 != iVar7);
  }
  aVar3 = this->field_0;
  if (((undefined1  [96])aVar3 & (undefined1  [96])0x1) != (undefined1  [96])0x0) {
    puVar8 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.parameter_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_00._M_str = in_R9;
    field_name_00._M_len = (size_t)"google.protobuf.compiler.CodeGeneratorRequest.parameter";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar8,(char *)(ulong)*(uint *)(puVar8 + 1),1,0x37,field_name_00);
    s_00._M_str = (char *)*puVar8;
    s_00._M_len = puVar8[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,s_00,target);
  }
  if (((undefined1  [96])aVar3 & (undefined1  [96])0x2) != (undefined1  [96])0x0) {
    value = (this->field_0)._impl_.compiler_version_;
    target = internal::WireFormatLite::InternalWriteMessage
                       (3,(MessageLite *)value,*(int *)((long)&value->field_0 + 4),target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  if (iVar1 != 0) {
    iVar7 = 0;
    do {
      pVVar5 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                         (&(this->field_0)._impl_.proto_file_.super_RepeatedPtrFieldBase,iVar7);
      target = internal::WireFormatLite::InternalWriteMessage
                         (0xf,(MessageLite *)pVVar5,(pVVar5->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      iVar7 = iVar7 + 1;
    } while (iVar1 != iVar7);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x40);
  if (iVar1 != 0) {
    iVar7 = 0;
    do {
      pVVar5 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                         (&(this->field_0)._impl_.source_file_descriptors_.
                           super_RepeatedPtrFieldBase,iVar7);
      target = internal::WireFormatLite::InternalWriteMessage
                         (0x11,(MessageLite *)pVVar5,(pVVar5->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      iVar7 = iVar7 + 1;
    } while (iVar1 != iVar7);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    puVar6 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar6;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL CodeGeneratorRequest::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const CodeGeneratorRequest& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.CodeGeneratorRequest)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated string file_to_generate = 1;
  for (int i = 0, n = this_._internal_file_to_generate_size(); i < n; ++i) {
    const auto& s = this_._internal_file_to_generate().Get(i);
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
    target = stream->WriteString(1, s, target);
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string parameter = 2;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_parameter();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.compiler.CodeGeneratorRequest.parameter");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // optional .google.protobuf.compiler.Version compiler_version = 3;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        3, *this_._impl_.compiler_version_, this_._impl_.compiler_version_->GetCachedSize(), target,
        stream);
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_proto_file_size());
       i < n; i++) {
    const auto& repfield = this_._internal_proto_file().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            15, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.FileDescriptorProto source_file_descriptors = 17;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_source_file_descriptors_size());
       i < n; i++) {
    const auto& repfield = this_._internal_source_file_descriptors().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            17, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.CodeGeneratorRequest)
  return target;
}